

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreTextureTarget
               (ContextType *contextType,GLenum target)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar1) {
    if (0x8c29 < (int)target) {
      if (0x90ff < (int)target) {
        if (target == 0x9100) {
          return true;
        }
        if (target != 0x9102) {
          return false;
        }
        return true;
      }
      if (target == 0x8c2a) {
        return true;
      }
      if (target != 0x9009) {
        return false;
      }
      return true;
    }
LAB_009183ff:
    if ((int)target < 0x8513) {
      if (target == 0xde1) {
        return true;
      }
      if (target == 0x806f) {
        return true;
      }
    }
    else {
      if (target == 0x8513) {
        return true;
      }
      if (target == 0x8c1a) {
        return true;
      }
    }
    return false;
  }
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
  if (!bVar1) {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
    if (!bVar1) {
      return false;
    }
    goto LAB_009183ff;
  }
  bVar2 = 1;
  if ((int)target < 0x8513) {
    if ((target == 0xde1) || (target == 0x806f)) goto LAB_00918451;
  }
  else if ((target == 0x8513) || (target == 0x8c1a)) goto LAB_00918451;
  bVar2 = 0;
LAB_00918451:
  return (bool)(target == 0x9100 | bVar2);
}

Assistant:

static bool isCoreTextureTarget (const glu::ContextType& contextType, glw::GLenum target)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreTextureTarget(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreTextureTarget(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreTextureTarget(target);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}